

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

bool __thiscall llvm::detail::DoubleAPFloat::bitwiseIsEqual(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  bool bVar1;
  
  bVar1 = APFloat::bitwiseIsEqual
                    ((this->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                     (RHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
  if (bVar1) {
    bVar1 = APFloat::bitwiseIsEqual
                      ((this->Floats)._M_t.
                       super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                       .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                       (RHS->Floats)._M_t.
                       super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                       .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
    return bVar1;
  }
  return false;
}

Assistant:

bool DoubleAPFloat::bitwiseIsEqual(const DoubleAPFloat &RHS) const {
  return Floats[0].bitwiseIsEqual(RHS.Floats[0]) &&
         Floats[1].bitwiseIsEqual(RHS.Floats[1]);
}